

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.h
# Opt level: O0

Client * operator<<(Client *stream,Response *resp)

{
  bool bVar1;
  ostream *poVar2;
  ulong __n;
  element_type *peVar3;
  string *in_RSI;
  string *in_RDI;
  long *in_FS_OFFSET;
  unsigned_long i;
  size_t bytes_count;
  stringstream ss;
  string *data;
  ulong local_1d8;
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [376];
  string *local_10;
  string *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_198);
  poVar2 = std::operator<<(local_188,local_10);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(local_10 + 0x88));
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,local_10 + 0x68);
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Date: ");
  poVar2 = std::operator<<(poVar2,local_10 + 0x90);
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Server: ");
  poVar2 = std::operator<<(poVar2,local_10 + 0x20);
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Content-Length: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(ulong *)(local_10 + 0x60));
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Connection: ");
  poVar2 = std::operator<<(poVar2,local_10 + 0x40);
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Content-Type: ");
  poVar2 = std::operator<<(poVar2,local_10 + 0xb0);
  poVar2 = std::operator<<(poVar2,"\r\n");
  std::operator<<(poVar2,"\r\n");
  data = local_8;
  std::__cxx11::stringstream::str();
  Client::operator<<((Client *)poVar2,data);
  std::__cxx11::string::~string(local_1c8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(local_10 + 0xd0));
  if (bVar1) {
    for (local_1d8 = 0; __n = *(ulong *)(local_10 + 0x60) / 0x19000, local_1d8 < __n;
        local_1d8 = local_1d8 + 1) {
      peVar3 = std::
               __shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x109392);
      std::istream::read((char *)peVar3,*in_FS_OFFSET + -0x19000);
      Client::write((Client *)local_8,(int)*in_FS_OFFSET + -0x19000,(void *)0x19000,__n);
    }
    if (*(ulong *)(local_10 + 0x60) % 0x19000 != 0) {
      peVar3 = std::
               __shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x10946b);
      std::istream::read((char *)peVar3,*in_FS_OFFSET + -0x19000);
      Client::write((Client *)local_8,(int)*in_FS_OFFSET + -0x19000,
                    (void *)(*(ulong *)(local_10 + 0x60) % 0x19000),0x19000);
    }
    peVar3 = std::
             __shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1094ec);
    std::ios::clear(peVar3 + *(long *)(*(long *)peVar3 + -0x18),0);
    peVar3 = std::
             __shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x109516);
    std::istream::seekg((long)peVar3,_S_beg);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  return (Client *)local_8;
}

Assistant:

T& operator<<(T& stream, const Response& resp) {
    std::stringstream ss;
    ss  << resp.protocol << " " << resp.status.code    << " " << resp.status.status << "\r\n"
        << "Date: "             << resp.date           << "\r\n"
        << "Server: "           << resp.server         << "\r\n"
        << "Content-Length: "   << resp.content_length << "\r\n"
        << "Connection: "       << resp.connection     << "\r\n"
        << "Content-Type: "     << resp.content_type   << "\r\n"
        << "\r\n";

    stream << ss.str();

    if (resp.body) {
        size_t bytes_count = BUFFER_SIZE * sizeof(Byte); 

        for (unsigned long i = 0; i < resp.content_length / bytes_count; i++) {
            resp.body->read(static_cast<char*>(buff), bytes_count);
            stream.write(static_cast<char*>(buff), bytes_count);
        }
        if (resp.content_length % bytes_count) {
            resp.body->read(static_cast<char*>(buff), resp.content_length % bytes_count);
            stream.write(static_cast<char*>(buff), resp.content_length % bytes_count);
        }

        resp.body->clear();
        resp.body->seekg(0, std::ios::beg);
    }

    return stream;
}